

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O1

void __thiscall t_generator::generate_program(t_generator *this)

{
  int iVar1;
  long lVar2;
  pointer pptVar3;
  pointer pptVar4;
  pointer pptVar5;
  pointer pptVar6;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  vector<t_struct_*,_std::allocator<t_struct_*>_> local_d8;
  vector<t_service_*,_std::allocator<t_service_*>_> local_c0;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> local_a8;
  vector<t_const_*,_std::allocator<t_const_*>_> local_90;
  vector<t_const_*,_std::allocator<t_const_*>_> local_78;
  vector<t_enum_*,_std::allocator<t_enum_*>_> local_60;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (*this->_vptr_t_generator[0xf])();
  std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector(&local_60,&this->program_->enums_);
  pptVar6 = local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      (*this->_vptr_t_generator[0x13])(this,*pptVar6);
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
            (&local_a8,&this->program_->typedefs_);
  for (pptVar4 = local_a8.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar4 !=
      local_a8.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    (*this->_vptr_t_generator[0x12])(this,*pptVar4);
  }
  std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector(&local_d8,&this->program_->objects_);
  for (pptVar5 = local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar5 !=
      local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    (*this->_vptr_t_generator[0x17])(this,*pptVar5);
  }
  pptVar5 = local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar1 = (*((*pptVar5)->super_t_type).super_t_doc._vptr_t_doc[0xc])();
      lVar2 = 0xa8;
      if ((char)iVar1 != '\0') {
        lVar2 = 0xc0;
      }
      (**(code **)((long)this->_vptr_t_generator + lVar2))(this,*pptVar5);
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_78,&this->program_->consts_);
  std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_90,&local_78);
  (*this->_vptr_t_generator[0x11])(this,&local_90);
  if (local_90.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
            (&local_c0,&this->program_->services_);
  if (local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar3 = local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      (*this->_vptr_t_generator[0x1a])((string *)local_48,this,*pptVar3);
      std::__cxx11::string::operator=((string *)&this->service_name_,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      (*this->_vptr_t_generator[0x16])(this,*pptVar3);
      pptVar3 = pptVar3 + 1;
    } while (pptVar3 !=
             local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  (*this->_vptr_t_generator[0x10])(this);
  if (local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_generator::generate_program() {
  // Initialize the generator
  init_generator();

  // Generate enums
  vector<t_enum*> enums = program_->get_enums();
  vector<t_enum*>::iterator en_iter;
  for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
    generate_enum(*en_iter);
  }

  // Generate typedefs
  vector<t_typedef*> typedefs = program_->get_typedefs();
  vector<t_typedef*>::iterator td_iter;
  for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
    generate_typedef(*td_iter);
  }

  // Generate structs, exceptions, and unions in declared order
  vector<t_struct*> objects = program_->get_objects();

  vector<t_struct*>::iterator o_iter;
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    generate_forward_declaration(*o_iter);
  }
  for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
    if ((*o_iter)->is_xception()) {
      generate_xception(*o_iter);
    } else {
      generate_struct(*o_iter);
    }
  }

  // Generate constants
  vector<t_const*> consts = program_->get_consts();
  generate_consts(consts);

  // Generate services
  vector<t_service*> services = program_->get_services();
  vector<t_service*>::iterator sv_iter;
  for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
    service_name_ = get_service_name(*sv_iter);
    generate_service(*sv_iter);
  }

  // Close the generator
  close_generator();
}